

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Exp_PrintNodeVerilog(FILE *pFile,int nVars,Vec_Int_t *p,Vec_Ptr_t *vNames,int Node,int fCompl)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  int fCompl_local;
  int Node_local;
  Vec_Ptr_t *vNames_local;
  Vec_Int_t *p_local;
  int nVars_local;
  FILE *pFile_local;
  
  iVar1 = Vec_IntEntry(p,Node * 2 + 1);
  if (SBORROW4(iVar1,nVars * 2) == iVar1 + nVars * -2 < 0) {
    fprintf((FILE *)pFile,"(");
  }
  uVar2 = Vec_IntEntry(p,Node * 2 + 1);
  Exp_PrintLitVerilog(pFile,nVars,p,vNames,uVar2 ^ fCompl);
  iVar1 = Vec_IntEntry(p,Node * 2 + 1);
  if (SBORROW4(iVar1,nVars * 2) == iVar1 + nVars * -2 < 0) {
    fprintf((FILE *)pFile,")");
  }
  uVar3 = 0x26;
  if (fCompl != 0) {
    uVar3 = 0x7c;
  }
  fprintf((FILE *)pFile," %c ",uVar3);
  iVar1 = Vec_IntEntry(p,Node << 1);
  if (SBORROW4(iVar1,nVars * 2) == iVar1 + nVars * -2 < 0) {
    fprintf((FILE *)pFile,"(");
  }
  uVar2 = Vec_IntEntry(p,Node << 1);
  Exp_PrintLitVerilog(pFile,nVars,p,vNames,uVar2 ^ fCompl);
  iVar1 = Vec_IntEntry(p,Node << 1);
  if (SBORROW4(iVar1,nVars * 2) == iVar1 + nVars * -2 < 0) {
    fprintf((FILE *)pFile,")");
  }
  return;
}

Assistant:

void Exp_PrintNodeVerilog( FILE * pFile, int nVars, Vec_Int_t * p, Vec_Ptr_t * vNames, int Node, int fCompl )
{
    extern void Exp_PrintLitVerilog( FILE * pFile, int nVars, Vec_Int_t * p, Vec_Ptr_t * vNames, int Lit );
    if ( Vec_IntEntry(p, 2*Node+1) >= 2*nVars )
        fprintf( pFile, "(" );
    Exp_PrintLitVerilog( pFile, nVars, p, vNames, Vec_IntEntry(p, 2*Node+1) ^ fCompl );
    if ( Vec_IntEntry(p, 2*Node+1) >= 2*nVars )
        fprintf( pFile, ")" );
    fprintf( pFile, " %c ", fCompl ? '|' : '&' );
    if ( Vec_IntEntry(p, 2*Node+0) >= 2*nVars )
        fprintf( pFile, "(" );
    Exp_PrintLitVerilog( pFile, nVars, p, vNames, Vec_IntEntry(p, 2*Node+0) ^ fCompl );
    if ( Vec_IntEntry(p, 2*Node+0) >= 2*nVars )
        fprintf( pFile, ")" );
}